

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::Convert2Var(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,AffineExpr *ee)

{
  bool bVar1;
  AlgebraicExpression<mp::LinTerms> *in_RSI;
  undefined1 in_stack_00000f4f;
  LinTerms *in_stack_00000f50;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  LinearFunctionalConstraint *in_stack_ffffffffffffff30;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff38;
  type in_stack_ffffffffffffff58;
  type in_stack_ffffffffffffff60;
  int local_4;
  
  bVar1 = AlgebraicExpression<mp::LinTerms>::is_variable
                    ((AlgebraicExpression<mp::LinTerms> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (bVar1) {
    local_4 = LinTerms::get_representing_variable((LinTerms *)0x37e304);
  }
  else {
    bVar1 = AlgebraicExpression<mp::LinTerms>::is_constant
                      ((AlgebraicExpression<mp::LinTerms> *)0x37e31d);
    if (bVar1) {
      AlgebraicExpression<mp::LinTerms>::constant_term(in_RSI);
      MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
      local_4 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x37e357);
    }
    else {
      LinTerms::sort_terms(in_stack_00000f50,(bool)in_stack_00000f4f);
      LinTerms::shrink_to_fit
                ((LinTerms *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      LinearFunctionalConstraint::LinearFunctionalConstraint
                ((LinearFunctionalConstraint *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (AffineExpr *)&stack0xffffffffffffff30);
      local_4 = AssignResultVar2Args<mp::LinearFunctionalConstraint>
                          (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      LinearFunctionalConstraint::~LinearFunctionalConstraint
                ((LinearFunctionalConstraint *)CONCAT44(local_4,in_stack_ffffffffffffff10));
    }
  }
  return local_4;
}

Assistant:

int Convert2Var(AffineExpr&& ee) {
    if (ee.is_variable())
      return ee.get_representing_variable();
    if (ee.is_constant())
      return int( MakeFixedVar(ee.constant_term()) );
    ee.sort_terms();
    ee.shrink_to_fit();
    return AssignResultVar2Args(
            LinearFunctionalConstraint(std::move(ee)));
  }